

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

void amrex::computeGradient(MultiFab *grad,Array<const_MultiFab_*,_3> *umac,Geometry *geom)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  Real dzi;
  Real dyi;
  Real dxi;
  MFIter mfi;
  int local_23c;
  Box local_1ac;
  Array4<double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  dVar1 = (geom->super_CoordSys).inv_dx[0];
  dVar2 = (geom->super_CoordSys).inv_dx[1];
  dVar3 = (geom->super_CoordSys).inv_dx[2];
  MFIter::MFIter(&local_90,(FabArrayBase *)grad,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_1ac,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,&grad->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,&umac->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&umac->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&umac->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_90);
      if (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2]) {
        lVar9 = (long)local_1ac.smallend.vect[1];
        lVar5 = (long)local_1ac.smallend.vect[0] * 8;
        iVar4 = local_1ac.smallend.vect[2];
        local_23c = local_1ac.smallend.vect[2];
        do {
          local_23c = local_23c + 1;
          if (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1]) {
            lVar8 = (long)iVar4;
            lVar6 = (long)local_190.begin.x;
            lVar11 = local_150.jstride * 8;
            lVar12 = (lVar9 - local_150.begin.y) * lVar11;
            lVar10 = (long)local_150.p +
                     (lVar8 - local_150.begin.z) * local_150.kstride * 8 + lVar12 +
                     (long)local_150.begin.x * -8 + lVar5;
            lVar18 = (long)local_150.p +
                     (long)(local_23c - local_150.begin.z) * local_150.kstride * 8 + lVar12 +
                     (long)local_150.begin.x * -8 + lVar5;
            lVar16 = local_110.jstride * 8;
            lVar14 = (lVar8 - local_110.begin.z) * local_110.kstride;
            lVar7 = (long)local_110.p +
                    (lVar9 - local_110.begin.y) * lVar16 + lVar14 * 8 + (long)local_110.begin.x * -8
                    + lVar5;
            iVar13 = (local_1ac.smallend.vect[1] + 1) - local_110.begin.y;
            lVar20 = local_190.jstride * 8;
            lVar12 = (lVar9 - local_190.begin.y) * lVar20 +
                     (lVar8 - local_190.begin.z) * local_190.kstride * 8;
            lVar15 = (long)local_190.p + local_190.nstride * 0x10 + lVar12 + lVar6 * -8 + lVar5;
            lVar17 = (long)local_190.p + lVar12 + local_190.nstride * 8 + lVar6 * -8 + lVar5;
            lVar6 = (long)local_190.p + lVar12 + lVar6 * -8 + lVar5;
            lVar8 = (long)local_d0.p +
                    (lVar9 - local_d0.begin.y) * local_d0.jstride * 8 +
                    (lVar8 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_d0.begin.x * -8
                    + lVar5 + 8;
            lVar12 = lVar9;
            do {
              if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
                lVar19 = 0;
                do {
                  *(double *)(lVar6 + lVar19 * 8) =
                       (*(double *)(lVar8 + lVar19 * 8) - *(double *)(lVar8 + -8 + lVar19 * 8)) *
                       dVar1;
                  *(double *)(lVar17 + lVar19 * 8) =
                       (*(double *)
                         ((long)local_110.p +
                         lVar19 * 8 +
                         iVar13 * lVar16 + lVar14 * 8 + (long)local_110.begin.x * -8 + lVar5) -
                       *(double *)(lVar7 + lVar19 * 8)) * dVar2;
                  *(double *)(lVar15 + lVar19 * 8) =
                       (*(double *)(lVar18 + lVar19 * 8) - *(double *)(lVar10 + lVar19 * 8)) * dVar3
                  ;
                  lVar19 = lVar19 + 1;
                } while ((local_1ac.bigend.vect[0] - local_1ac.smallend.vect[0]) + 1 != (int)lVar19)
                ;
              }
              lVar12 = lVar12 + 1;
              lVar10 = lVar10 + lVar11;
              lVar18 = lVar18 + lVar11;
              lVar7 = lVar7 + lVar16;
              iVar13 = iVar13 + 1;
              lVar15 = lVar15 + lVar20;
              lVar17 = lVar17 + lVar20;
              lVar6 = lVar6 + lVar20;
              lVar8 = lVar8 + local_d0.jstride * 8;
            } while (local_1ac.bigend.vect[1] + 1 != (int)lVar12);
          }
          bVar21 = iVar4 != local_1ac.bigend.vect[2];
          iVar4 = iVar4 + 1;
        } while (bVar21);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void computeGradient (MultiFab& grad,  const Array<MultiFab const*,AMREX_SPACEDIM>& umac,
                          const Geometry& geom)
    {
        AMREX_ASSERT(grad.nComp() >= AMREX_SPACEDIM);

#if (AMREX_SPACEDIM==2)
        const auto& ba = grad.boxArray();
        const auto& dm = grad.DistributionMap();
        MultiFab volume, areax, areay;
        if (geom.IsRZ()) {
            geom.GetVolume(volume, ba, dm, 0);
            geom.GetFaceArea(areax, ba, dm, 0, 0);
            geom.GetFaceArea(areay, ba, dm, 1, 0);
        }
#endif

        const GpuArray<Real,AMREX_SPACEDIM> dxinv = geom.InvCellSizeArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(grad,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            const auto& gradfab = grad.array(mfi);
            AMREX_D_TERM(const auto& ufab = umac[0]->const_array(mfi);,
                         const auto& vfab = umac[1]->const_array(mfi);,
                         const auto& wfab = umac[2]->const_array(mfi););
#if (AMREX_SPACEDIM==2)
            if (geom.IsRZ()) {
                Array4<Real const> const&  ax =  areax.array(mfi);
                Array4<Real const> const&  ay =  areay.array(mfi);
                Array4<Real const> const& vol = volume.array(mfi);

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_gradient_rz(tbx,gradfab,AMREX_D_DECL(ufab,vfab,wfab),ax,ay,vol);
                });
            } else
#endif
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_gradient(tbx,gradfab,AMREX_D_DECL(ufab,vfab,wfab),dxinv);
                });
            }
        }
    }